

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_opt_set_params(int np,ggml_tensor **ps,float *x)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int j;
  int ne;
  int p;
  int i;
  undefined4 local_28;
  undefined4 local_20;
  float in_stack_fffffffffffffff8;
  
  for (local_20 = 0; local_20 < in_EDI; local_20 = local_20 + 1) {
    iVar1 = ggml_nelements(*(ggml_tensor **)(in_RSI + (long)local_20 * 8));
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      ggml_set_f32_1d(_j,in_EDI,in_stack_fffffffffffffff8);
    }
  }
  return;
}

Assistant:

static void ggml_opt_set_params(int np, struct ggml_tensor * const ps[], const float * x) {
    int i = 0;
    for (int p = 0; p < np; ++p) {
        const int ne = ggml_nelements(ps[p]) ;
        // TODO: add function to set tensor from array
        for (int j = 0; j < ne; ++j) {
            ggml_set_f32_1d(ps[p], j, x[i++]);
        }
    }
}